

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O2

int __thiscall RandStrAltList::maxlen(RandStrAltList *this)

{
  RandStrNode *pRVar1;
  int iVar2;
  RandStrNode **ppRVar3;
  int iVar4;
  
  iVar4 = 0;
  ppRVar3 = &(this->super_RandStrNode).firstChild;
  while (pRVar1 = *ppRVar3, pRVar1 != (RandStrNode *)0x0) {
    iVar2 = (*pRVar1->_vptr_RandStrNode[2])(pRVar1);
    if (iVar4 < iVar2) {
      iVar4 = iVar2;
    }
    ppRVar3 = &pRVar1->nextSibling;
  }
  return iVar4;
}

Assistant:

virtual int maxlen()
    {
        int lmax = 0;
        for (RandStrNode *chi = firstChild ; chi != 0 ; chi = chi->nextSibling)
        {
            int l = chi->maxlen();
            if (l > lmax)
                lmax = l;
        }

        return lmax;
    }